

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O2

bool __thiscall HighsTimer::running(HighsTimer *this,HighsInt i_clock)

{
  double *pdVar1;
  
  if (i_clock == -0x2e) {
    printf("HighsTimer: querying clock %d: %s - with start record %g\n",
           (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[-0x2e],0xffffffffffffffd2,
           (this->clock_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-0x2e]._M_dataplus._M_p);
  }
  pdVar1 = (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + i_clock;
  return *pdVar1 <= 0.0 && *pdVar1 != 0.0;
}

Assistant:

bool running(const HighsInt i_clock = 0  //!< Index of the clock to be read
  ) {
    assert(i_clock >= 0);
    assert(i_clock < num_clock);
    if (i_clock == check_clock) {
      printf("HighsTimer: querying clock %d: %s - with start record %g\n",
             int(check_clock), this->clock_names[check_clock].c_str(),
             clock_start[i_clock]);
    }
    return clock_start[i_clock] < 0;
  }